

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

size_t gnuplotio::
       get_range_size<gnuplotio::PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>,gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::pair<double,double>const*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>,std::pair<double,double>>>>
                 (PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>,_std::pair<double,_double>_>_>
                  *arg)

{
  bool bVar1;
  undefined1 local_38 [8];
  PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>,_std::pair<double,_double>_>_>
  i;
  size_t ret;
  PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>,_std::pair<double,_double>_>_>
  *arg_local;
  
  i.r.end._M_current = (pair<double,_double> *)0x0;
  local_38 = (undefined1  [8])(arg->l).it._M_current;
  i.l.it._M_current = (arg->l).end._M_current;
  i.l.end._M_current = &((arg->r).it._M_current)->first;
  i.r.it._M_current = (arg->r).end._M_current;
  while( true ) {
    bVar1 = PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>,_std::pair<double,_double>_>_>
            ::is_end((PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>,_std::pair<double,_double>_>_>
                      *)local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    i.r.end._M_current = (pair<double,_double> *)((long)&(i.r.end._M_current)->first + 1);
    PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>,_std::pair<double,_double>_>_>
    ::inc((PairOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>,_std::pair<double,_double>_>_>
           *)local_38);
  }
  return (size_t)i.r.end._M_current;
}

Assistant:

size_t get_range_size(const T &arg) {
    // FIXME - not the fastest way.  Implement a size() method for range.
    size_t ret = 0;
    for(T i=arg; !i.is_end(); i.inc()) ++ret;
    return ret;
}